

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

int cuddHashTableInsert2(DdHashTable *hash,DdNode *f,DdNode *g,DdNode *value,ptrint count)

{
  int *piVar1;
  DdHashItem **ppDVar2;
  DdHashItem *pDVar3;
  uint uVar4;
  
  if (hash->maxsize < hash->size) {
    cuddHashTableResize(hash);
  }
  pDVar3 = cuddHashTableAlloc(hash);
  if (pDVar3 != (DdHashItem *)0x0) {
    hash->size = hash->size + 1;
    pDVar3->value = value;
    piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3->count = count;
    pDVar3->key[0] = f;
    pDVar3[1].next = (DdHashItem *)g;
    uVar4 = (((uint)g & 1) + *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2 +
            (((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
            0x40f1f9 >> ((byte)hash->shift & 0x1f);
    ppDVar2 = hash->bucket;
    pDVar3->next = ppDVar2[uVar4];
    ppDVar2[uVar4] = pDVar3;
  }
  return (uint)(pDVar3 != (DdHashItem *)0x0);
}

Assistant:

int
cuddHashTableInsert2(
  DdHashTable * hash,
  DdNode * f,
  DdNode * g,
  DdNode * value,
  ptrint count)
{
    int result;
    unsigned int posn;
    DdHashItem *item;

#ifdef DD_DEBUG
    assert(hash->keysize == 2);
#endif

    if (hash->size > hash->maxsize) {
        result = cuddHashTableResize(hash);
        if (result == 0) return(0);
    }
    item = cuddHashTableAlloc(hash);
    if (item == NULL) return(0);
    hash->size++;
    item->value = value;
    cuddRef(value);
    item->count = count;
    item->key[0] = f;
    item->key[1] = g;
    posn = ddLCHash2(cuddF2L(f),cuddF2L(g),hash->shift);
    item->next = hash->bucket[posn];
    hash->bucket[posn] = item;

    return(1);

}